

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

void compact_upto_overwrite_test(int opt)

{
  fdb_seqnum_t seqnum;
  void *pvVar1;
  fdb_doc *pfVar2;
  fdb_kvs_handle *handle;
  fdb_status fVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  byte bVar11;
  ulong uVar12;
  bool opt_00;
  undefined4 uVar13;
  undefined4 uVar14;
  fdb_iterator *fit;
  int local_3cc;
  fdb_doc *doc;
  fdb_file_handle *db_file;
  fdb_kvs_handle *db;
  ulong local_3b0;
  char *local_3a8;
  uint64_t n_markers;
  fdb_snapshot_info_t *markers;
  fdb_kvs_handle *snap;
  ulong local_388;
  fdb_kvs_config local_380;
  char cmd [256];
  timeval __test_begin;
  fdb_kvs_info kvs_info;
  char key [256];
  fdb_config local_128;
  
  local_3cc = opt;
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  builtin_strncpy(cmd,"rm -rf  compact_test* > errorlog.txt",0x25);
  system(cmd);
  memleak_start();
  pcVar5 = (char *)malloc(0x20);
  fdb_get_default_config();
  local_128.seqtree_opt = '\x01';
  local_128.durability_opt = '\x02';
  local_128.wal_flush_before_commit = true;
  local_128.multi_kv_instances = true;
  local_128.buffercache_size = 0;
  local_128.block_reusing_threshold = 0;
  fdb_get_default_kvs_config();
  fVar3 = fdb_open(&db_file,"./compact_test",&local_128);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb30);
    compact_upto_overwrite_test(int)::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xb30,"void compact_upto_overwrite_test(int)");
  }
  fVar3 = fdb_kvs_open(db_file,&db,"db",&local_380);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb32);
    compact_upto_overwrite_test(int)::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xb32,"void compact_upto_overwrite_test(int)");
  }
  opt_00 = local_3cc == 0;
  local_3a8 = pcVar5 + 0x1a;
  uVar9 = 0;
  while (uVar9 != 10) {
    uVar8 = uVar9 - 5;
    if (uVar9 < 5) {
      uVar8 = uVar9;
    }
    sprintf(key,"key%06d",(ulong)uVar8);
    builtin_strncpy(pcVar5,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
    builtin_strncpy(local_3a8,"<end>",6);
    uVar8 = uVar9 - 5;
    if (uVar9 < 5) {
      pcVar10 = "value%08d";
      uVar8 = uVar9;
    }
    else {
      pcVar10 = "updated_value%08d";
    }
    sprintf(pcVar5,pcVar10,(ulong)uVar8);
    handle = db;
    sVar6 = strlen(key);
    fVar3 = fdb_set_kv(handle,key,sVar6 + 1,pcVar5,0x20);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xb40);
      compact_upto_overwrite_test(int)::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb40,"void compact_upto_overwrite_test(int)");
    }
    bVar11 = (byte)uVar9;
    if (local_3cc == 3) {
LAB_0010f59d:
      opt_00 = (bool)(bVar11 & 1);
    }
    else if (local_3cc == 2) {
      bVar11 = ~bVar11;
      goto LAB_0010f59d;
    }
    fVar3 = fdb_commit(db_file,opt_00);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xb4b);
      compact_upto_overwrite_test(int)::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb4b,"void compact_upto_overwrite_test(int)");
    }
    fVar3 = fdb_get_kvs_info(db,&kvs_info);
    uVar9 = uVar9 + 1;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xb4d);
      compact_upto_overwrite_test(int)::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb4d,"void compact_upto_overwrite_test(int)");
    }
  }
  fVar3 = fdb_get_all_snap_markers(db_file,&markers,&n_markers);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb51);
    compact_upto_overwrite_test(int)::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xb51,"void compact_upto_overwrite_test(int)");
  }
  uVar12 = CONCAT44(n_markers._4_4_,(uint)n_markers) >> 1;
  fVar3 = fdb_compact_upto(db_file,"./compact_test2",markers[(int)uVar12].marker);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb55);
    compact_upto_overwrite_test(int)::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xb55,"void compact_upto_overwrite_test(int)");
  }
  uVar7 = (ulong)(uint)n_markers;
  local_388 = uVar12;
  while( true ) {
    uVar9 = (uint)(uVar7 - 1);
    if ((int)uVar9 < 0) break;
    seqnum = (markers[uVar9 & 0x7fffffff].kvs_markers)->seqnum;
    local_3b0 = uVar7 - 1;
    fVar3 = fdb_snapshot_open(db,&snap,seqnum);
    if ((int)uVar12 < (int)local_3b0) {
      uVar7 = local_3b0;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xb60);
        compact_upto_overwrite_test(int)::__test_pass = 1;
        __assert_fail("s != FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xb60,"void compact_upto_overwrite_test(int)");
      }
    }
    else {
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xb5d);
        compact_upto_overwrite_test(int)::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xb5d,"void compact_upto_overwrite_test(int)");
      }
      fVar3 = fdb_iterator_init(snap,&fit,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xb65);
        compact_upto_overwrite_test(int)::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xb65,"void compact_upto_overwrite_test(int)");
      }
      uVar12 = 0;
      do {
        doc = (fdb_doc *)0x0;
        fVar3 = fdb_iterator_get(fit,&doc);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(key,"key%06d",uVar12 & 0xffffffff);
        builtin_strncpy(pcVar5,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
        builtin_strncpy(local_3a8,"<end>",6);
        pcVar10 = "value%08d";
        if (uVar12 < seqnum - 5) {
          pcVar10 = "updated_value%08d";
        }
        sprintf(pcVar5,pcVar10,uVar12 & 0xffffffff);
        pfVar2 = doc;
        pvVar1 = doc->key;
        iVar4 = bcmp(pvVar1,key,doc->keylen);
        if (iVar4 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",key,pvVar1,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xb74);
          compact_upto_overwrite_test(int)::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xb74,"void compact_upto_overwrite_test(int)");
        }
        pvVar1 = pfVar2->body;
        iVar4 = bcmp(pvVar1,pcVar5,pfVar2->bodylen);
        if (iVar4 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pcVar5,pvVar1,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xb75);
          compact_upto_overwrite_test(int)::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xb75,"void compact_upto_overwrite_test(int)");
        }
        uVar12 = uVar12 + 1;
        fdb_doc_free(pfVar2);
        fVar3 = fdb_iterator_next(fit);
      } while (fVar3 == FDB_RESULT_SUCCESS);
      fVar3 = fdb_iterator_close(fit);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xb7a);
        compact_upto_overwrite_test(int)::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xb7a,"void compact_upto_overwrite_test(int)");
      }
      if ((int)uVar12 != 5) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xb7b);
        compact_upto_overwrite_test(int)::__test_pass = 1;
        __assert_fail("c == (n/2)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xb7b,"void compact_upto_overwrite_test(int)");
      }
      fVar3 = fdb_kvs_close(snap);
      uVar7 = local_3b0;
      uVar12 = local_388;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xb7e);
        compact_upto_overwrite_test(int)::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xb7e,"void compact_upto_overwrite_test(int)");
      }
    }
  }
  fVar3 = fdb_iterator_init(db,&fit,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb83);
    compact_upto_overwrite_test(int)::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xb83,"void compact_upto_overwrite_test(int)");
  }
  uVar12 = 0;
  do {
    uVar9 = (uint)uVar12;
    doc = (fdb_doc *)0x0;
    fVar3 = fdb_iterator_get(fit,&doc);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    sprintf(key,"key%06d",uVar12);
    builtin_strncpy(pcVar5,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
    builtin_strncpy(local_3a8,"<end>",6);
    sprintf(pcVar5,"updated_value%08d",uVar12);
    pfVar2 = doc;
    pvVar1 = doc->key;
    iVar4 = bcmp(pvVar1,key,doc->keylen);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",key,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xb8e);
      compact_upto_overwrite_test(int)::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb8e,"void compact_upto_overwrite_test(int)");
    }
    pvVar1 = pfVar2->body;
    iVar4 = bcmp(pvVar1,pcVar5,pfVar2->bodylen);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pcVar5,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xb8f);
      compact_upto_overwrite_test(int)::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb8f,"void compact_upto_overwrite_test(int)");
    }
    uVar9 = uVar9 + 1;
    uVar12 = (ulong)uVar9;
    fdb_doc_free(pfVar2);
    fVar3 = fdb_iterator_next(fit);
  } while (fVar3 == FDB_RESULT_SUCCESS);
  fVar3 = fdb_iterator_close(fit);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb94);
    compact_upto_overwrite_test(int)::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xb94,"void compact_upto_overwrite_test(int)");
  }
  if (uVar9 != 5) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb95);
    compact_upto_overwrite_test(int)::__test_pass = 1;
    __assert_fail("c == (n/2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xb95,"void compact_upto_overwrite_test(int)");
  }
  fVar3 = fdb_free_snap_markers(markers,CONCAT44(n_markers._4_4_,(uint)n_markers));
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb98);
    compact_upto_overwrite_test(int)::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xb98,"void compact_upto_overwrite_test(int)");
  }
  free(pcVar5);
  fVar3 = fdb_close(db_file);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb9b);
    compact_upto_overwrite_test(int)::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xb9b,"void compact_upto_overwrite_test(int)");
  }
  fVar3 = fdb_shutdown();
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb9d);
    compact_upto_overwrite_test(int)::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xb9d,"void compact_upto_overwrite_test(int)");
  }
  memleak_end();
  builtin_strncpy(cmd + 0x10,"rwrite test",0xc);
  builtin_strncpy(cmd,"compact upto ove",0x10);
  switch(local_3cc) {
  case 0:
    sVar6 = strlen(cmd);
    builtin_strncpy(cmd + sVar6," (HB+trie)",0xb);
    break;
  case 1:
    sVar6 = strlen(cmd);
    builtin_strncpy(cmd + sVar6," (WAL)",7);
    break;
  case 2:
    sVar6 = strlen(cmd);
    builtin_strncpy(cmd + sVar6 + 0xe,"ie/WAL)",8);
    uVar13._0_1_ = ' ';
    uVar13._1_1_ = 'H';
    uVar13._2_1_ = 'B';
    uVar13._3_1_ = '+';
    uVar14._0_1_ = 't';
    uVar14._1_1_ = 'r';
    uVar14._2_1_ = 'i';
    uVar14._3_1_ = 'e';
    goto LAB_0010fa49;
  case 3:
    sVar6 = strlen(cmd);
    builtin_strncpy(cmd + sVar6 + 0xe,"B+trie)",8);
    uVar13._0_1_ = ' ';
    uVar13._1_1_ = 'W';
    uVar13._2_1_ = 'A';
    uVar13._3_1_ = 'L';
    uVar14._0_1_ = '/';
    uVar14._1_1_ = 'H';
    uVar14._2_1_ = 'B';
    uVar14._3_1_ = '+';
LAB_0010fa49:
    pcVar5 = cmd + sVar6;
    pcVar5[0] = ' ';
    pcVar5[1] = '(';
    pcVar5[2] = 'm';
    pcVar5[3] = 'i';
    pcVar5 = cmd + sVar6 + 4;
    pcVar5[0] = 'x';
    pcVar5[1] = 'e';
    pcVar5[2] = 'd';
    pcVar5[3] = ',';
    *(undefined4 *)(cmd + sVar6 + 8) = uVar13;
    *(undefined4 *)(cmd + sVar6 + 0xc) = uVar14;
  }
  pcVar5 = "%s PASSED\n";
  if (compact_upto_overwrite_test(int)::__test_pass != '\0') {
    pcVar5 = "%s FAILED\n";
  }
  fprintf(_stderr,pcVar5,cmd);
  return;
}

Assistant:

void compact_upto_overwrite_test(int opt)
{
    TEST_INIT();

    int n = 10, value_len=32;
    int i, r, idx, c;
    char cmd[256];
    char key[256], *value;
    char keystr[] = "key%06d";
    char valuestr[] = "value%08d";
    char valuestr2[] = "updated_value%08d";
    fdb_file_handle *db_file;
    fdb_kvs_handle *db, *snap;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_status s;
    fdb_kvs_info kvs_info;
    fdb_iterator *fit;
    fdb_doc *doc;
    fdb_snapshot_info_t *markers;
    fdb_seqnum_t seqnum;
    fdb_commit_opt_t commit_opt;
    uint64_t n_markers;

    sprintf(cmd, SHELL_DEL " compact_test* > errorlog.txt");
    r = system(cmd);
    (void)r;

    memleak_start();

    value = (char*)malloc(value_len);

    config = fdb_get_default_config();
    config.durability_opt = FDB_DRB_ASYNC;
    config.seqtree_opt = FDB_SEQTREE_USE;
    config.wal_flush_before_commit = true;
    config.multi_kv_instances = true;
    config.buffercache_size = 0;
    config.block_reusing_threshold = 0;

    commit_opt = (opt)?FDB_COMMIT_NORMAL:FDB_COMMIT_MANUAL_WAL_FLUSH;

    kvs_config = fdb_get_default_kvs_config();

    s = fdb_open(&db_file, "./compact_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db, "db", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // === write ===
    for (i=0;i<n;++i){
        idx = i % (n/2);
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        if (i < (n/2)) {
            sprintf(value, valuestr, idx);
        } else {
            sprintf(value, valuestr2, idx);
        }
        s = fdb_set_kv(db, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        if (opt == 2) {
            // HB+trie, WAL, HB+trie, WAL...
            commit_opt = (i%2)?FDB_COMMIT_NORMAL:FDB_COMMIT_MANUAL_WAL_FLUSH;
        } else if (opt == 3) {
            // WAL, HB+trie, WAL, HB+trie...
            commit_opt = (i%2)?FDB_COMMIT_MANUAL_WAL_FLUSH:FDB_COMMIT_NORMAL;
        }

        s = fdb_commit(db_file, commit_opt);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_get_all_snap_markers(db_file, &markers, &n_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    int upto = n_markers/2;
    s = fdb_compact_upto(db_file, "./compact_test2", markers[upto].marker);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // iterating using snapshots with various seqnums
    for (i=n_markers-1; i>=0; --i) {
        seqnum = markers[i].kvs_markers->seqnum;

        s = fdb_snapshot_open(db, &snap, seqnum);
        if (i<=upto) {
            TEST_CHK(s == FDB_RESULT_SUCCESS);
        } else {
            // seqnum < (n/2) must fail
            TEST_CHK(s != FDB_RESULT_SUCCESS);
            continue;
        }

        s = fdb_iterator_init(snap, &fit, NULL, 0, NULL, 0, 0);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        c = 0;
        do {
            doc = NULL;
            s = fdb_iterator_get(fit, &doc);
            if (s != FDB_RESULT_SUCCESS) break;
            idx = c;
            sprintf(key, keystr, idx);
            memset(value, 'x', value_len);
            memcpy(value + value_len - 6, "<end>", 6);
            if ((fdb_seqnum_t)c >= seqnum-(n/2)) {
                sprintf(value, valuestr, idx);
            } else {
                sprintf(value, valuestr2, idx);
            }
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CMP(doc->body, value, doc->bodylen);
            c++;
            fdb_doc_free(doc);
        } while(fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
        s = fdb_iterator_close(fit);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CHK(c == (n/2));

        s = fdb_kvs_close(snap);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    // iterating using the original handle
    s = fdb_iterator_init(db, &fit, NULL, 0, NULL, 0, 0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    c = 0;
    do {
        doc = NULL;
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) break;
        idx = c;
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        sprintf(value, valuestr2, idx);
        TEST_CMP(doc->key, key, doc->keylen);
        TEST_CMP(doc->body, value, doc->bodylen);
        c++;
        fdb_doc_free(doc);
    } while(fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
    s = fdb_iterator_close(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(c == (n/2));

    s = fdb_free_snap_markers(markers, n_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    free(value);
    s = fdb_close(db_file);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memleak_end();

    sprintf(cmd, "compact upto overwrite test");
    if (opt == 0) {
        strcat(cmd, " (HB+trie)");
    } else if (opt == 1) {
        strcat(cmd, " (WAL)");
    } else if (opt == 2) {
        strcat(cmd, " (mixed, HB+trie/WAL)");
    } else if (opt == 3) {
        strcat(cmd, " (mixed, WAL/HB+trie)");
    }
    TEST_RESULT(cmd);
}